

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var.c
# Opt level: O0

void varcleanup(GlobalConfig *global)

{
  tool_var *ptVar1;
  tool_var *t;
  tool_var *list;
  GlobalConfig *global_local;
  
  t = global->variables;
  while (t != (tool_var *)0x0) {
    ptVar1 = t->next;
    free(t->content);
    free(t);
    t = ptVar1;
  }
  return;
}

Assistant:

void varcleanup(struct GlobalConfig *global)
{
  struct tool_var *list = global->variables;
  while(list) {
    struct tool_var *t = list;
    list = list->next;
    free(CURL_UNCONST(t->content));
    free(t);
  }
}